

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.cpp
# Opt level: O0

void scan_invalid(void)

{
  int in_stack_00000108;
  int in_stack_0000010c;
  char *in_stack_00000110;
  
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  fail_at_arg(in_stack_00000110,in_stack_0000010c,in_stack_00000108);
  return;
}

Assistant:

void scan_invalid()
{
#define BAD(s) fail_at_arg(s, 1, __LINE__);

    /*
        simple types
    */
    // not testable: mistyped keywords like "tru" are considered
    // valid identifiers

    /*
        colors
    */
    BAD("#deadhorse");
    BAD("#abcdefgh");
    BAD("#");

    /*
        timestamps
    */
    BAD("2016:11:16");
    BAD("16.11.2016");
#if 0
    BAD("2016-11-16 00"); // correct: date + int
#endif
    fail_at_arg("2016-11-16 00:00:0", 2, __LINE__); // 2 digits needed
    fail_at_arg("2016-11-16 00:00:00:1", 2, __LINE__); // period needed
    fail_at_arg("2016-11-16 00:00:00 (...+0x0p-32s)", 2,
                __LINE__); // period needed
    fail_at_arg("2016-11-16 00:00:00.1 (. ..+0x0p-32s)", 2, __LINE__);
    fail_at_arg("2016-11-16 00:00:00.1 (. ..+0x0p+32s)", 2, __LINE__);

    /*
        doubles
    */
    BAD("1.2.3d");
    BAD("1dd");

    /*
        floats
    */
    BAD("0xgp+1"); // no hex char
    BAD("1p+"); // 0x missing
    BAD(".e3"); // numbers missing
#if 0
    // reading strtod(3p) these don't look legal,
    // but "unfortunately" they work
    BAD("0x1p+"); // exponent missing
    BAD("1.0e"); // exponent missing
#endif

    BAD("1 (-0x1.8p+0)"); // only floating numbers have postfix
    fail_at_arg("1.0 -0x1.8p+0)", 3, __LINE__); // read as 2 ints + ')'
    BAD("1.0 (x1.8p+0)");
    BAD("1.0 (-0x1.8p+0");
    BAD("(-0x0p-32)"); // parentheses not allowed

    /*
        chars
    */
    BAD("''");
    BAD("'too many chars'");
    BAD("'\\k'");
    BAD("'\\\\\\'"); // 3 backslashes

    /*
        integers
    */
    BAD("42j");
    BAD("0xgg");
    BAD("0123Fh");

    /*
        MIDI
    */
    // valid identifier + invalid blob
    BAD("MIDI x");
    BAD("MIDI 0xff 0xff 0xff 0xff ]");
    fail_at_arg("2 MIDI [ 0xff ]", 2, __LINE__);
    BAD("MIDI [ 0 0xff 0xff 0xff ]");
    BAD("MIDI [ 0xff 0xff 0xff 0xff");

    /*
        strings
    */
    BAD("\"no endquote");
    BAD("\"\\\"no endquote 2");
    BAD("\\u");
    BAD("\\\\\\"); // 3 backslashes

    /*
        identifier aka symbols
    */
    fail_at_arg("identifier_with-minus-sign", 2, __LINE__);

    /*
        blobs
    */
    BAD("BLOB [");
    BAD("BLOB [ x ]");
    BAD("BLOB [ 1 ]");
    BAD("BLOB [ 2 0xff ]");
    BAD("BLOB [ 1 0xff 0xff ]");
    BAD("BLOB [ 0 0xff ]");
    BAD("BLOB [ 1 0xff 123 ]");
    BAD("BLOB [ 1 0xff ");
    BAD("BLOB [ 1 0xff");

    /*
        arrays
    */
    // note: array start and array args each do count
    fail_at_arg("[0 1 2", 4, __LINE__);
    fail_at_arg("[0 2h]", 3, __LINE__);
//  this bad array is currently not detected (TODO):
//  fail_at_arg("[0.0 1 ... 5]", 3, __LINE__);

    /*
        ranges
    */
    // the results are sometimes a bit strange here,
    // but let's at least document that they do not change
    BAD("... 25");
    BAD("4 ...");
    BAD("6 ... 12h"); // different types
    // there's no natural number "n" with 0.25n = 1.1:
    fail_at_arg("0.0 0.25 ... 1.1", 2, __LINE__);
    BAD("1.9f ... 0f");
    fail_at_arg("[ ... 3 ]", 2, __LINE__); // what is the range start here?
    BAD("\"ranges don't work \" ... \"with strings\"");
    BAD("-4 ... -4");
    BAD("[] ... [1 2 3]"); // no arrays in ranges
    // this has been disallowed (intercepting ranges):
    // was the intention "... 11 12 13 14 15" or "... 11 13 15" ?
    fail_at_arg("1 3 ... 11 ... 15", 5 , __LINE__);

    BAD("2x");

    // infinite ranges
    BAD("1 ..."); // not allowed outside of bundle

    /*
        long message
    */
    fail_at_arg("\"rtosc is\" true \"ly\" '\a' 0x6rea7 \"library\"",
                5, __LINE__);

#undef BAD
}